

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void fmt::report_system_error(int error_code,StringRef message)

{
  int in_stack_0000023c;
  FormatFunc in_stack_00000240;
  StringRef in_stack_00000248;
  
  anon_unknown_1::report_error(in_stack_00000240,in_stack_0000023c,in_stack_00000248);
  return;
}

Assistant:

FMT_FUNC void fmt::report_system_error(
    int error_code, fmt::StringRef message) FMT_NOEXCEPT {
  // 'fmt::' is for bcc32.
  fmt::report_error(internal::format_system_error, error_code, message);
}